

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O1

void __thiscall
btGenericMemoryPool::init_pool(btGenericMemoryPool *this,size_t element_size,size_t element_count)

{
  void *pvVar1;
  ulong uVar2;
  
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(size_t *)(this + 0x28) = element_size;
  *(size_t *)(this + 0x30) = element_count;
  pvVar1 = btAlignedAllocInternal(element_count * element_size,0x10);
  *(void **)this = pvVar1;
  pvVar1 = btAlignedAllocInternal(*(long *)(this + 0x30) << 3,0x10);
  *(void **)(this + 8) = pvVar1;
  pvVar1 = btAlignedAllocInternal(*(long *)(this + 0x30) << 3,0x10);
  *(void **)(this + 0x10) = pvVar1;
  if (*(long *)(this + 0x30) != 0) {
    uVar2 = 0;
    do {
      *(undefined8 *)((long)pvVar1 + uVar2 * 8) = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(this + 0x30));
  }
  return;
}

Assistant:

void btGenericMemoryPool::init_pool(size_t element_size, size_t element_count)
{
	m_allocated_count = 0;
	m_free_nodes_count = 0;

	m_element_size = element_size;
	m_max_element_count = element_count;




	m_pool = (unsigned char *) btAlignedAlloc(m_element_size*m_max_element_count,16);
	m_free_nodes = (size_t *) btAlignedAlloc(sizeof(size_t)*m_max_element_count,16);
	m_allocated_sizes = (size_t *) btAlignedAlloc(sizeof(size_t)*m_max_element_count,16);

	for (size_t i = 0;i< m_max_element_count;i++ )
	{
		m_allocated_sizes[i] = 0;
	}
}